

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMHighLevelEncoder.cpp
# Opt level: O2

ByteArray *
ZXing::DataMatrix::Encode
          (ByteArray *__return_storage_ptr__,wstring *msg,CharacterSet charset,SymbolShape shape,
          int minWidth,int minHeight,int maxWidth,int maxHeight)

{
  ulong uVar1;
  uint8_t *puVar2;
  size_type sVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  bool bVar4;
  uint8_t uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var9;
  undefined1 *puVar10;
  char *pcVar11;
  SymbolInfo *pSVar12;
  invalid_argument *piVar13;
  wchar_t *pwVar14;
  int startPos;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  undefined7 in_register_00000011;
  int iVar15;
  int iVar16;
  size_type sVar17;
  long lVar18;
  char cVar19;
  string *psVar20;
  int len;
  _Alloc_hider _Var21;
  uint uVar22;
  pointer pcVar23;
  wstring_view s;
  wstring_view s_00;
  wstring_view s_01;
  wstring_view s_02;
  wstring_view ss;
  wstring_view ss_00;
  wstring_view ss_01;
  wstring_view ss_02;
  undefined1 auVar24 [12];
  string buffer_1;
  EncoderContext context;
  string buffer;
  string local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_40;
  ulong local_38;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  
  uVar1 = CONCAT71(in_register_00000011,charset);
  if ((int)CONCAT71(in_register_00000011,charset) == 0) {
    uVar1 = 2;
  }
  local_40 = &__return_storage_ptr__->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
  TextEncoder::FromUnicode
            (&buffer_1,(TextEncoder *)msg,(wstring *)(uVar1 & 0xffffffff),(CharacterSet)shape);
  EncoderContext::EncoderContext(&context,&buffer_1);
  std::__cxx11::string::~string((string *)&buffer_1);
  context._maxWidth = maxWidth;
  context._maxHeight = maxHeight;
  s._M_str = (msg->_M_dataplus)._M_p;
  s._M_len = msg->_M_string_length;
  ss._M_str = L"[)>\x1e05\x1d";
  ss._M_len = 7;
  pwVar14 = L"[)>\x1e05\x1d";
  context._shape = shape;
  context._minWidth = minWidth;
  context._minHeight = minHeight;
  bVar4 = StartsWith(s,ss);
  if (bVar4) {
    s_00._M_str = (msg->_M_dataplus)._M_p;
    s_00._M_len = msg->_M_string_length;
    ss_00._M_str = pwVar14;
    ss_00._M_len = extraout_RDX;
    bVar4 = EndsWith(s_00,ss_00);
    uVar5 = 0xec;
    if (!bVar4) goto LAB_0016a310;
  }
  else {
LAB_0016a310:
    s_01._M_str = (msg->_M_dataplus)._M_p;
    s_01._M_len = msg->_M_string_length;
    ss_01._M_str = L"[)>\x1e06\x1d";
    ss_01._M_len = 7;
    pwVar14 = L"[)>\x1e06\x1d";
    bVar4 = StartsWith(s_01,ss_01);
    if (!bVar4) goto LAB_0016a35c;
    s_02._M_str = (msg->_M_dataplus)._M_p;
    s_02._M_len = msg->_M_string_length;
    ss_02._M_str = pwVar14;
    ss_02._M_len = extraout_RDX_00;
    bVar4 = EndsWith(s_02,ss_02);
    uVar5 = 0xed;
    if (!bVar4) goto LAB_0016a35c;
  }
  EncoderContext::addCodeword(&context,uVar5);
  context._skipAtEnd = 2;
  context._pos = 7;
LAB_0016a35c:
  uVar22 = 0;
  do {
    local_38 = (ulong)uVar22;
    do {
      lVar18 = CONCAT44(context._msg._M_string_length._4_4_,(int)context._msg._M_string_length);
      if ((int)context._msg._M_string_length - context._skipAtEnd <= context._pos) {
        iVar15 = (int)context._codewords.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                      .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                 (int)context._codewords.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                      .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        pSVar12 = EncoderContext::updateSymbolInfo(&context,iVar15);
        this = local_40;
        iVar7 = pSVar12->_dataCapacity;
        if ((iVar15 < iVar7) && ((5 < uVar22 || ((0x31U >> (uVar22 & 0x1f) & 1) == 0)))) {
          EncoderContext::addCodeword(&context,0xfe);
        }
        if ((int)context._codewords.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
            (int)context._codewords.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start < iVar7) {
          EncoderContext::addCodeword(&context,0x81);
        }
        while ((int)context._codewords.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
               (int)context._codewords.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start < iVar7) {
          lVar18 = (long)(((int)context._codewords.
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (int)context._codewords.
                               super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start) * 0x95 + 0x95) % 0xfd;
          EncoderContext::addCodeword(&context,(char)lVar18 + (0x7c < (int)lVar18) * '\x02' + 0x82);
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (this,&context._codewords.
                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
        EncoderContext::~EncoderContext(&context);
        return (ByteArray *)this;
      }
      if (5 < uVar22) goto LAB_0016a9d7;
      cVar19 = (char)&buffer;
      psVar20 = &buffer;
      switch((long)&switchD_0016a3c5::switchdataD_0019ce24 +
             (long)(int)(&switchD_0016a3c5::switchdataD_0019ce24)[local_38]) {
      case 0x16a3c7:
        pcVar23 = context._msg._M_dataplus._M_p + context._pos;
        _Var9 = std::
                __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<bool(*)(int)>>
                          (pcVar23,context._msg._M_dataplus._M_p + lVar18,IsDigit);
        uVar6 = EncoderContext::currentChar(&context);
        cVar19 = (char)uVar6;
        if ((int)_Var9._M_current - (int)pcVar23 < 2) {
          uVar8 = LookAheadTest(&context._msg,(long)context._pos,0);
          if (uVar8 == 0) {
            if ((uVar6 & 0xffffff80) == 0x80) {
              EncoderContext::addCodeword(&context,0xeb);
              EncoderContext::addCodeword(&context,cVar19 + 0x81);
            }
            else {
              EncoderContext::addCodeword(&context,cVar19 + '\x01');
            }
            context._pos = context._pos + 1;
          }
          else {
            EncoderContext::addCodeword(&context,*(uint8_t *)((long)&LATCHES + (ulong)uVar8));
            context._newEncoding = uVar8;
          }
        }
        else {
          iVar7 = EncoderContext::nextChar(&context);
          uVar5 = cVar19 * '\n' + (char)iVar7 + 'r';
          if (9 < iVar7 - 0x30U) {
            uVar5 = '?';
          }
          if (9 < uVar6 - 0x30) {
            uVar5 = '?';
          }
          EncoderContext::addCodeword(&context,uVar5);
          context._pos = context._pos + 2;
        }
        goto LAB_0016a9d7;
      case 0x16a43e:
        buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
        buffer._M_string_length = 0;
        buffer.field_2._M_local_buf[0] = '\0';
        do {
          if ((int)context._msg._M_string_length - context._skipAtEnd <= context._pos) break;
          uVar6 = EncoderContext::currentChar(&context);
          if (((uVar6 & 0xffffffe0) != 0x20) && (0x1e < uVar6 - 0x40)) {
            auVar24 = __cxa_allocate_exception(0x10);
            ToHexString_abi_cxx11_(&local_60,(DataMatrix *)(ulong)uVar6,auVar24._8_4_);
            std::operator+(&buffer_1,"Illegal character: ",&local_60);
            std::invalid_argument::invalid_argument(auVar24._0_8_,(string *)&buffer_1);
            __cxa_throw(auVar24._0_8_,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          std::__cxx11::string::push_back(cVar19);
          context._pos = context._pos + 1;
          if (buffer._M_string_length < 4) {
LAB_0016a527:
            iVar7 = 0;
          }
          else {
            EdifactEncoder::EncodeToCodewords((ByteArray *)&buffer_1,&buffer,startPos);
            sVar3 = buffer_1._M_string_length;
            for (_Var21 = buffer_1._M_dataplus; _Var21._M_p != (pointer)sVar3;
                _Var21._M_p = _Var21._M_p + 1) {
              EncoderContext::addCodeword(&context,*_Var21._M_p);
            }
            std::__cxx11::string::erase((ulong)&buffer,0);
            iVar15 = LookAheadTest(&context._msg,(long)context._pos,4);
            iVar7 = 0;
            if (iVar15 != 4) {
              context._newEncoding = 0;
              iVar7 = 3;
            }
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&buffer_1);
            if (iVar15 == 4) goto LAB_0016a527;
          }
        } while (iVar7 == 0);
        std::__cxx11::string::push_back(cVar19);
        sVar3 = buffer._M_string_length;
        if (buffer._M_string_length != 0) {
          if (buffer._M_string_length == 1) {
            len = (int)context._codewords.
                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                  (int)context._codewords.
                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
            pSVar12 = EncoderContext::updateSymbolInfo(&context,len);
            iVar15 = pSVar12->_dataCapacity - len;
            iVar16 = (int)context._msg._M_string_length - (context._skipAtEnd + context._pos);
            iVar7 = extraout_EDX_00;
            if (iVar15 < iVar16) {
              pSVar12 = EncoderContext::updateSymbolInfo(&context,len + 1);
              iVar15 = pSVar12->_dataCapacity - len;
              iVar7 = extraout_EDX_01;
            }
            if ((iVar16 <= iVar15) && (iVar15 < 3)) break;
          }
          else {
            iVar7 = extraout_EDX;
            if (4 < buffer._M_string_length) {
              piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(piVar13,"Count must not exceed 4");
              __cxa_throw(piVar13,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
          }
          EdifactEncoder::EncodeToCodewords((ByteArray *)&buffer_1,&buffer,iVar7);
          bVar4 = context._pos < (int)context._msg._M_string_length - context._skipAtEnd;
          _Var21 = buffer_1._M_dataplus;
          puVar2 = (uint8_t *)buffer_1._M_string_length;
          if (3 < sVar3) {
LAB_0016a9ec:
            for (; (uint8_t *)_Var21._M_p != puVar2;
                _Var21._M_p = (pointer)((uint8_t *)_Var21._M_p + 1)) {
              EncoderContext::addCodeword(&context,*_Var21._M_p);
            }
          }
          else {
            iVar15 = (int)sVar3 + -1;
            iVar7 = (int)context._codewords.
                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                    (int)context._codewords.
                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
            pSVar12 = EncoderContext::updateSymbolInfo(&context,iVar15 + iVar7);
            if (2 < pSVar12->_dataCapacity - iVar7) {
              EncoderContext::updateSymbolInfo
                        (&context,((uint)buffer_1._M_string_length - (int)buffer_1._M_dataplus._M_p)
                                  + iVar7);
              _Var21 = buffer_1._M_dataplus;
              puVar2 = (uint8_t *)buffer_1._M_string_length;
              goto LAB_0016a9ec;
            }
            _Var21 = buffer_1._M_dataplus;
            puVar2 = (uint8_t *)buffer_1._M_string_length;
            if (3 < sVar3 || bVar4) goto LAB_0016a9ec;
            context._symbolInfo = (SymbolInfo *)0x0;
            context._pos = context._pos - iVar15;
          }
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&buffer_1);
          goto LAB_0016a9c5;
        }
        break;
      case 0x16a5af:
        buffer_1._M_string_length = 0;
        buffer_1._M_dataplus._M_p = (pointer)DMTextEncoder::EncodeChar;
        buffer_1.field_2._8_8_ =
             std::
             _Function_handler<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_int_(*)(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             ::_M_invoke;
        buffer_1.field_2._M_allocated_capacity =
             (size_type)
             std::
             _Function_handler<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_int_(*)(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             ::_M_manager;
        C40Encoder::EncodeC40
                  (&context,(function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                             *)&buffer_1,2);
LAB_0016a70a:
        std::_Function_base::~_Function_base((_Function_base *)&buffer_1);
        goto LAB_0016a9d7;
      case 0x16a5f1:
        buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
        buffer._M_string_length = 0;
        buffer.field_2._M_local_buf[0] = '\0';
        while (context._pos < (int)lVar18 - context._skipAtEnd) {
          uVar6 = EncoderContext::currentChar(&context);
          context._pos = context._pos + 1;
          if (((((uVar6 != 0xd) && (uVar6 != 0x20)) && (uVar6 != 0x3e)) &&
              ((uVar6 != 0x2a && (9 < uVar6 - 0x30)))) && (0x19 < uVar6 - 0x41)) {
            auVar24 = __cxa_allocate_exception(0x10);
            ToHexString_abi_cxx11_(&local_60,(DataMatrix *)(ulong)uVar6,auVar24._8_4_);
            std::operator+(&buffer_1,"Illegal character: ",&local_60);
            std::invalid_argument::invalid_argument(auVar24._0_8_,(string *)&buffer_1);
            __cxa_throw(auVar24._0_8_,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          std::__cxx11::string::push_back(cVar19);
          if (buffer._M_string_length % 3 == 0) {
            C40Encoder::WriteNextTriplet(&context,&buffer);
            iVar7 = LookAheadTest(&context._msg,(long)context._pos,3);
            if (iVar7 != 3) {
              context._newEncoding = 0;
              break;
            }
          }
          lVar18 = CONCAT44(context._msg._M_string_length._4_4_,(int)context._msg._M_string_length);
        }
        iVar7 = (int)context._codewords.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
                (int)context._codewords.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
        pSVar12 = EncoderContext::updateSymbolInfo(&context,iVar7);
        context._pos = context._pos - (int)buffer._M_string_length;
        iVar15 = (int)context._msg._M_string_length - (context._pos + context._skipAtEnd);
        if (((1 < iVar15) || (iVar7 = pSVar12->_dataCapacity - iVar7, 1 < iVar7)) ||
           (iVar15 != iVar7)) {
          EncoderContext::addCodeword(&context,0xfe);
        }
        if (context._newEncoding < 0) {
LAB_0016a9c5:
          context._newEncoding = 0;
        }
        break;
      case 0x16a6cd:
        buffer_1._M_string_length = 0;
        buffer_1._M_dataplus._M_p = (pointer)C40Encoder::EncodeChar;
        buffer_1.field_2._8_8_ =
             std::
             _Function_handler<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_int_(*)(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             ::_M_invoke;
        buffer_1.field_2._M_allocated_capacity =
             (size_type)
             std::
             _Function_handler<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_int_(*)(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             ::_M_manager;
        C40Encoder::EncodeC40
                  (&context,(function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                             *)&buffer_1,1);
        goto LAB_0016a70a;
      case 0x16a717:
        buffer_1._M_dataplus._M_p = (pointer)&buffer_1.field_2;
        buffer_1._M_string_length = 0;
        buffer_1.field_2._M_allocated_capacity =
             buffer_1.field_2._M_allocated_capacity & 0xffffffffffffff00;
        std::__cxx11::string::push_back((char)&buffer_1);
        do {
          if ((int)context._msg._M_string_length - context._skipAtEnd <= context._pos)
          goto LAB_0016a780;
          EncoderContext::currentChar(&context);
          std::__cxx11::string::push_back((char)&buffer_1);
          lVar18 = (long)context._pos;
          context._pos = (int)(lVar18 + 1U);
          iVar7 = LookAheadTest(&context._msg,lVar18 + 1U,5);
        } while (iVar7 == 5);
        context._newEncoding = 0;
LAB_0016a780:
        uVar6 = (uint)buffer_1._M_string_length;
        iVar7 = ((int)context._codewords.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                      .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (int)context._codewords.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start) + (uint)buffer_1._M_string_length;
        pSVar12 = EncoderContext::updateSymbolInfo(&context,iVar7);
        if ((iVar7 < pSVar12->_dataCapacity) ||
           (context._pos < (int)context._msg._M_string_length - context._skipAtEnd)) {
          uVar8 = uVar6 - 1;
          if ((int)uVar6 < 0xfb) {
            puVar10 = (undefined1 *)std::__cxx11::string::at((ulong)&buffer_1);
            *puVar10 = (char)uVar8;
          }
          else {
            if (0x614 < uVar6) {
              piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::__cxx11::to_string(&buffer,uVar8);
              std::operator+(&local_60,"Message length not in valid ranges: ",&buffer);
              std::invalid_argument::invalid_argument(piVar13,(string *)&local_60);
              __cxa_throw(piVar13,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            pcVar11 = (char *)std::__cxx11::string::at((ulong)&buffer_1);
            *pcVar11 = (char)((uVar8 & 0xffff) / 0xfa) + -7;
            std::__cxx11::string::insert((ulong)&buffer_1,1,'\x01');
          }
        }
        sVar3 = buffer_1._M_string_length;
        _Var21._M_p = buffer_1._M_dataplus._M_p;
        for (sVar17 = 0; sVar3 != sVar17; sVar17 = sVar17 + 1) {
          EncoderContext::addCodeword
                    (&context,_Var21._M_p[sVar17] +
                              (char)((((int)context._codewords.
                                            super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                            .
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (int)context._codewords.
                                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                           .
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start) * 0x95 + 0x95)
                                    % 0xff) + '\x01');
        }
        psVar20 = &buffer_1;
      }
      std::__cxx11::string::~string((string *)psVar20);
LAB_0016a9d7:
      iVar7 = context._newEncoding;
    } while (context._newEncoding < 0);
    context._newEncoding = -1;
    uVar22 = iVar7;
  } while( true );
}

Assistant:

ByteArray Encode(const std::wstring& msg, CharacterSet charset, SymbolShape shape, int minWidth, int minHeight, int maxWidth, int maxHeight)
{
	//the codewords 0..255 are encoded as Unicode characters
	//Encoder[] encoders = {
	//	new ASCIIEncoder(), new C40Encoder(), new TextEncoder(),
	//	new X12Encoder(), new EdifactEncoder(),  new Base256Encoder()
	//};

	if (charset == CharacterSet::Unknown) {
		charset = CharacterSet::ISO8859_1;
	}

	EncoderContext context(TextEncoder::FromUnicode(msg, charset));
	context.setSymbolShape(shape);
	context.setSizeConstraints(minWidth, minHeight, maxWidth, maxHeight);

	constexpr std::wstring_view MACRO_05_HEADER = L"[)>\x1E""05\x1D";
	constexpr std::wstring_view MACRO_06_HEADER = L"[)>\x1E""06\x1D";
	constexpr std::wstring_view MACRO_TRAILER = L"\x1E\x04";

	if (StartsWith(msg, MACRO_05_HEADER) && EndsWith(msg, MACRO_TRAILER)) {
		context.addCodeword(MACRO_05);
		context.setSkipAtEnd(2);
		context.setCurrentPos(Size(MACRO_05_HEADER));
	}
	else if (StartsWith(msg, MACRO_06_HEADER) && EndsWith(msg, MACRO_TRAILER)) {
		context.addCodeword(MACRO_06);
		context.setSkipAtEnd(2);
		context.setCurrentPos(Size(MACRO_06_HEADER));
	}

	int encodingMode = ASCII_ENCODATION; //Default mode
	while (context.hasMoreCharacters()) {
		switch (encodingMode) {
		case ASCII_ENCODATION:   ASCIIEncoder::EncodeASCII(context);     break;
		case C40_ENCODATION:     C40Encoder::EncodeC40(context);         break;
		case TEXT_ENCODATION:    DMTextEncoder::EncodeText(context);     break;
		case X12_ENCODATION:     X12Encoder::EncodeX12(context);         break;
		case EDIFACT_ENCODATION: EdifactEncoder::EncodeEdifact(context); break;
		case BASE256_ENCODATION: Base256Encoder::EncodeBase256(context); break;
		}
		if (context.newEncoding() >= 0) {
			encodingMode = context.newEncoding();
			context.clearNewEncoding();
		}
	}
	int len = context.codewordCount();
	auto symbolInfo = context.updateSymbolInfo(len);
	int capacity = symbolInfo->dataCapacity();
	if (len < capacity) {
		if (encodingMode != ASCII_ENCODATION && encodingMode != BASE256_ENCODATION && encodingMode != EDIFACT_ENCODATION) {
			context.addCodeword('\xfe'); //Unlatch (254)
		}
	}
	//Padding
	if (context.codewordCount() < capacity) {
		context.addCodeword(PAD);
	}
	while (context.codewordCount() < capacity) {
		context.addCodeword(Randomize253State(PAD, context.codewordCount() + 1));
	}

	return context.codewords();
}